

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall ot::commissioner::Interpreter::Value::Value(Value *this,Error *aError)

{
  pointer pcVar1;
  
  (this->mError).mCode = aError->mCode;
  (this->mError).mMessage._M_dataplus._M_p = (pointer)&(this->mError).mMessage.field_2;
  pcVar1 = (aError->mMessage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->mError).mMessage,pcVar1,pcVar1 + (aError->mMessage)._M_string_length)
  ;
  (this->mData)._M_dataplus._M_p = (pointer)&(this->mData).field_2;
  (this->mData)._M_string_length = 0;
  (this->mData).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Interpreter::Value::Value(Error aError)
    : mError(aError)
{
}